

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  OPJ_UINT32 OVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  uint uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  OPJ_INT16 *pOVar13;
  char *fmt;
  opj_pi_resolution_t *poVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  opj_event_mgr_t *p_event_mgr;
  ulong uVar21;
  opj_pi_comp_t *poVar22;
  long lVar23;
  uint uVar24;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    uVar18 = (pi->poc).compno0;
    if ((uVar18 < pi->numcomps) && (uVar16 = (pi->poc).compno1, uVar16 < pi->numcomps + 1)) {
      if (pi->first == 0) goto LAB_0012c87e;
      pi->first = 0;
      pi->layno = (pi->poc).layno0;
      do {
        if ((pi->poc).layno1 <= pi->layno) {
          return 0;
        }
        pi->resno = (pi->poc).resno0;
        while (pi->resno < (pi->poc).resno1) {
          pi->compno = uVar18;
          while (uVar12 = pi->compno, uVar12 < uVar16) {
            uVar19 = pi->resno;
            if (uVar19 < pi->comps[uVar12].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar14 = pi->comps[uVar12].resolutions;
                (pi->poc).precno1 = poVar14[uVar19].ph * poVar14[uVar19].pw;
              }
              pi->precno = (pi->poc).precno0;
              while (pi->precno < (pi->poc).precno1) {
                uVar12 = pi->precno * pi->step_p + pi->step_c * pi->compno +
                         pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar12) goto LAB_0012c88b;
                pOVar13 = pi->include;
                uVar20 = (ulong)uVar12;
                if (pOVar13[uVar20] == 0) {
LAB_0012c89e:
                  pOVar13[uVar20] = 1;
                  return 1;
                }
LAB_0012c87e:
                pi->precno = pi->precno + 1;
              }
            }
            pi->compno = pi->compno + 1;
          }
          pi->resno = pi->resno + 1;
        }
        pi->layno = pi->layno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_lrcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RLCP:
    uVar18 = (pi->poc).compno0;
    if ((uVar18 < pi->numcomps) && (uVar16 = (pi->poc).compno1, uVar16 < pi->numcomps + 1)) {
      if (pi->first == 0) goto LAB_0012c95b;
      pi->first = 0;
      pi->resno = (pi->poc).resno0;
      do {
        if ((pi->poc).resno1 <= pi->resno) {
          return 0;
        }
        pi->layno = (pi->poc).layno0;
        while (pi->layno < (pi->poc).layno1) {
          pi->compno = uVar18;
          while (uVar12 = pi->compno, uVar12 < uVar16) {
            uVar19 = pi->resno;
            if (uVar19 < pi->comps[uVar12].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar14 = pi->comps[uVar12].resolutions;
                (pi->poc).precno1 = poVar14[uVar19].ph * poVar14[uVar19].pw;
              }
              pi->precno = (pi->poc).precno0;
              while (pi->precno < (pi->poc).precno1) {
                uVar12 = pi->precno * pi->step_p + pi->step_c * pi->compno +
                         pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar12) goto LAB_0012c88b;
                pOVar13 = pi->include;
                uVar20 = (ulong)uVar12;
                if (pOVar13[uVar20] == 0) goto LAB_0012c89e;
LAB_0012c95b:
                pi->precno = pi->precno + 1;
              }
            }
            pi->compno = pi->compno + 1;
          }
          pi->layno = pi->layno + 1;
        }
        pi->resno = pi->resno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rlcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RPCL:
    uVar18 = (pi->poc).compno0;
    uVar16 = pi->numcomps;
    if ((uVar18 < uVar16) && (uVar12 = (pi->poc).compno1, uVar12 < uVar16 + 1)) {
      if (pi->first == 0) goto LAB_0012cc83;
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      uVar20 = 0;
      do {
        uVar19 = pi->comps[uVar20].numresolutions;
        uVar21 = (ulong)uVar19;
        if (uVar21 != 0) {
          poVar22 = pi->comps + uVar20;
          poVar14 = poVar22->resolutions;
          lVar23 = 0;
          do {
            uVar19 = uVar19 - 1;
            uVar24 = *(int *)((long)&poVar14->pdx + lVar23) + uVar19;
            if (uVar24 < 0x20) {
              bVar9 = (byte)uVar24;
              if (poVar22->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar17 = poVar22->dx << (bVar9 & 0x1f);
                uVar24 = pi->dx;
                uVar8 = uVar17;
                if (uVar24 < uVar17) {
                  uVar8 = uVar24;
                }
                if (uVar24 == 0) {
                  uVar8 = uVar17;
                }
                pi->dx = uVar8;
              }
            }
            uVar24 = *(int *)((long)&poVar14->pdy + lVar23) + uVar19;
            if (uVar24 < 0x20) {
              bVar9 = (byte)uVar24;
              if (poVar22->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar17 = poVar22->dy << (bVar9 & 0x1f);
                uVar24 = pi->dy;
                uVar8 = uVar17;
                if (uVar24 < uVar17) {
                  uVar8 = uVar24;
                }
                if (uVar24 == 0) {
                  uVar8 = uVar17;
                }
                pi->dy = uVar8;
              }
            }
            lVar23 = lVar23 + 0x10;
          } while (uVar21 << 4 != lVar23);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar16);
      if (pi->dx == 0) {
        return 0;
      }
      if (pi->dy == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar1 = pi->tx0;
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = OVar1;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->resno = (pi->poc).resno0;
      do {
        if ((pi->poc).resno1 <= pi->resno) {
          return 0;
        }
        pi->y = (pi->poc).ty0;
        while (pi->y < (pi->poc).ty1) {
          pi->x = (pi->poc).tx0;
          while (pi->x < (pi->poc).tx1) {
            pi->compno = uVar18;
            while (uVar16 = pi->compno, uVar16 < uVar12) {
              uVar19 = pi->resno;
              uVar24 = pi->comps[uVar16].numresolutions;
              if ((uVar19 < uVar24) && (uVar24 = uVar24 + ~uVar19, uVar24 < 0x20)) {
                poVar22 = pi->comps + uVar16;
                uVar16 = poVar22->dx;
                bVar9 = (byte)uVar24;
                uVar8 = uVar16 << (bVar9 & 0x1f);
                if (uVar8 >> (bVar9 & 0x1f) == uVar16) {
                  uVar17 = poVar22->dy;
                  uVar15 = uVar17 << (bVar9 & 0x1f);
                  if ((uVar15 >> (bVar9 & 0x1f) == uVar17) && (-1 < (int)(uVar15 | uVar8))) {
                    if (uVar16 << (bVar9 & 0x1f) == 0) {
LAB_0012d38a:
                      __assert_fail("b",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                    ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
                    }
                    uVar20 = CONCAT44(0,uVar8);
                    auVar2._8_4_ = 0;
                    auVar2._0_8_ = uVar20;
                    auVar5._8_4_ = 0 >> (bVar9 & 0x1f);
                    auVar5._0_8_ = uVar20 + pi->tx0 + -1;
                    if (uVar17 << (bVar9 & 0x1f) == 0) goto LAB_0012d38a;
                    poVar14 = poVar22->resolutions + uVar19;
                    uVar21 = (ulong)uVar15;
                    uVar19 = poVar14->pdx + uVar24;
                    if ((uVar19 < 0x1f) &&
                       (bVar10 = (byte)uVar19, uVar16 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar24 = poVar14->pdy + uVar24;
                      if (uVar24 < 0x1f) {
                        bVar11 = (byte)uVar24;
                        uVar19 = uVar17 << (bVar11 & 0x1f);
                        if (uVar19 >> (bVar11 & 0x1f) == uVar17) {
                          uVar24 = pi->y;
                          uVar8 = (uint)(((uVar21 + pi->ty0) - 1) / uVar21);
                          if ((uVar24 % uVar19 == 0) ||
                             ((uVar24 == pi->ty0 &&
                              ((uVar8 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar19 = pi->x;
                            uVar17 = SUB124(auVar5 / auVar2,0);
                            if (((uVar19 % (uVar16 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar19 == pi->tx0 &&
                                 ((uVar17 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar14->pw != 0 &&
                                (((poVar14->ph != 0 &&
                                  (uVar17 != (uint)(((ulong)pi->tx1 + (uVar20 - 1)) / uVar20))) &&
                                 (uVar8 != (uint)(((uVar21 + pi->ty1) - 1) / uVar21))))))) {
                              bVar9 = (byte)poVar14->pdx;
                              bVar10 = (byte)poVar14->pdy;
                              pi->precno = (((uint)(((uVar21 - 1) + (ulong)uVar24) / uVar21) >>
                                            (bVar10 & 0x1f)) - (uVar8 >> (bVar10 & 0x1f))) *
                                           poVar14->pw +
                                           (((uint)(((uVar20 - 1) + (ulong)uVar19) / uVar20) >>
                                            (bVar9 & 0x1f)) - (uVar17 >> (bVar9 & 0x1f)));
                              pi->layno = (pi->poc).layno0;
                              while (pi->layno < (pi->poc).layno1) {
                                uVar16 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                         pi->step_r * pi->resno + pi->layno * pi->step_l;
                                if (pi->include_size <= uVar16) goto LAB_0012c88b;
                                pOVar13 = pi->include;
                                uVar20 = (ulong)uVar16;
                                if (pOVar13[uVar20] == 0) {
LAB_0012cc90:
                                  pOVar13[uVar20] = 1;
                                  return 1;
                                }
LAB_0012cc83:
                                pi->layno = pi->layno + 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pi->compno = pi->compno + 1;
            }
            pi->x = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          pi->y = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        pi->resno = pi->resno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rpcl(): invalid compno0/compno1\n";
    break;
  case OPJ_PCRL:
    uVar18 = (pi->poc).compno0;
    uVar16 = pi->numcomps;
    if ((uVar18 < uVar16) && (uVar12 = (pi->poc).compno1, uVar12 < uVar16 + 1)) {
      if (pi->first == 0) {
        poVar22 = pi->comps + pi->compno;
        goto LAB_0012cfb3;
      }
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      uVar20 = 0;
      do {
        uVar19 = pi->comps[uVar20].numresolutions;
        uVar21 = (ulong)uVar19;
        if (uVar21 != 0) {
          poVar22 = pi->comps + uVar20;
          poVar14 = poVar22->resolutions;
          lVar23 = 0;
          do {
            uVar19 = uVar19 - 1;
            uVar24 = *(int *)((long)&poVar14->pdx + lVar23) + uVar19;
            if (uVar24 < 0x20) {
              bVar9 = (byte)uVar24;
              if (poVar22->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar17 = poVar22->dx << (bVar9 & 0x1f);
                uVar24 = pi->dx;
                uVar8 = uVar17;
                if (uVar24 < uVar17) {
                  uVar8 = uVar24;
                }
                if (uVar24 == 0) {
                  uVar8 = uVar17;
                }
                pi->dx = uVar8;
              }
            }
            uVar24 = *(int *)((long)&poVar14->pdy + lVar23) + uVar19;
            if (uVar24 < 0x20) {
              bVar9 = (byte)uVar24;
              if (poVar22->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar17 = poVar22->dy << (bVar9 & 0x1f);
                uVar24 = pi->dy;
                uVar8 = uVar17;
                if (uVar24 < uVar17) {
                  uVar8 = uVar24;
                }
                if (uVar24 == 0) {
                  uVar8 = uVar17;
                }
                pi->dy = uVar8;
              }
            }
            lVar23 = lVar23 + 0x10;
          } while (uVar21 << 4 != lVar23);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar16);
      if (pi->dx == 0) {
        return 0;
      }
      if (pi->dy == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar1 = pi->tx0;
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = OVar1;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->y = (pi->poc).ty0;
      do {
        if ((pi->poc).ty1 <= pi->y) {
          return 0;
        }
        pi->x = (pi->poc).tx0;
        while (pi->x < (pi->poc).tx1) {
          pi->compno = uVar18;
          while (pi->compno < uVar12) {
            poVar22 = pi->comps + pi->compno;
            pi->resno = (pi->poc).resno0;
            while( true ) {
              uVar16 = pi->resno;
              uVar19 = (pi->poc).resno1;
              uVar24 = poVar22->numresolutions;
              if (uVar24 <= uVar19) {
                uVar19 = uVar24;
              }
              if (uVar19 <= uVar16) break;
              uVar24 = uVar24 + ~uVar16;
              if (uVar24 < 0x20) {
                uVar19 = poVar22->dx;
                bVar9 = (byte)uVar24;
                uVar8 = uVar19 << (bVar9 & 0x1f);
                if (uVar8 >> (bVar9 & 0x1f) == uVar19) {
                  uVar17 = poVar22->dy;
                  uVar15 = uVar17 << (bVar9 & 0x1f);
                  if ((uVar15 >> (bVar9 & 0x1f) == uVar17) && (-1 < (int)(uVar15 | uVar8))) {
                    if (uVar19 << (bVar9 & 0x1f) == 0) goto LAB_0012d38a;
                    uVar20 = CONCAT44(0,uVar8);
                    auVar3._8_4_ = 0;
                    auVar3._0_8_ = uVar20;
                    auVar6._8_4_ = 0 >> (bVar9 & 0x1f);
                    auVar6._0_8_ = uVar20 + pi->tx0 + -1;
                    if (uVar17 << (bVar9 & 0x1f) == 0) goto LAB_0012d38a;
                    poVar14 = poVar22->resolutions + uVar16;
                    uVar21 = (ulong)uVar15;
                    uVar16 = poVar14->pdx + uVar24;
                    if ((uVar16 < 0x1f) &&
                       (bVar10 = (byte)uVar16, uVar19 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar24 = poVar14->pdy + uVar24;
                      if (uVar24 < 0x1f) {
                        bVar11 = (byte)uVar24;
                        uVar16 = uVar17 << (bVar11 & 0x1f);
                        if (uVar16 >> (bVar11 & 0x1f) == uVar17) {
                          uVar24 = pi->y;
                          uVar8 = (uint)(((pi->ty0 + uVar21) - 1) / uVar21);
                          if ((uVar24 % uVar16 == 0) ||
                             ((uVar24 == pi->ty0 &&
                              ((uVar8 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar16 = pi->x;
                            uVar17 = SUB124(auVar6 / auVar3,0);
                            if (((uVar16 % (uVar19 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar16 == pi->tx0 &&
                                 ((uVar17 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar14->pw != 0 &&
                                (((poVar14->ph != 0 &&
                                  (uVar17 != (uint)(((ulong)pi->tx1 + (uVar20 - 1)) / uVar20))) &&
                                 (uVar8 != (uint)(((uVar21 + pi->ty1) - 1) / uVar21))))))) {
                              bVar9 = (byte)poVar14->pdx;
                              bVar10 = (byte)poVar14->pdy;
                              pi->precno = (((uint)(((uVar21 - 1) + (ulong)uVar24) / uVar21) >>
                                            (bVar10 & 0x1f)) - (uVar8 >> (bVar10 & 0x1f))) *
                                           poVar14->pw +
                                           (((uint)(((uVar20 - 1) + (ulong)uVar16) / uVar20) >>
                                            (bVar9 & 0x1f)) - (uVar17 >> (bVar9 & 0x1f)));
                              pi->layno = (pi->poc).layno0;
                              while (pi->layno < (pi->poc).layno1) {
                                uVar16 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                         pi->step_r * pi->resno + pi->layno * pi->step_l;
                                if (pi->include_size <= uVar16) goto LAB_0012c88b;
                                pOVar13 = pi->include;
                                uVar20 = (ulong)uVar16;
                                if (pOVar13[uVar20] == 0) goto LAB_0012cc90;
LAB_0012cfb3:
                                pi->layno = pi->layno + 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pi->resno = pi->resno + 1;
            }
            pi->compno = pi->compno + 1;
          }
          pi->x = (pi->x + pi->dx) - pi->x % pi->dx;
        }
        pi->y = (pi->y + pi->dy) - pi->y % pi->dy;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_pcrl(): invalid compno0/compno1\n";
    break;
  case OPJ_CPRL:
    uVar18 = (pi->poc).compno0;
    if ((uVar18 < pi->numcomps) && (uVar16 = (pi->poc).compno1, uVar16 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        poVar22 = pi->comps + pi->compno;
        goto LAB_0012d3ea;
      }
      pi->first = 0;
      pi->compno = uVar18;
      do {
        if (uVar16 <= pi->compno) {
          return 0;
        }
        poVar22 = pi->comps + pi->compno;
        pi->dx = 0;
        pi->dy = 0;
        uVar18 = poVar22->numresolutions;
        uVar20 = (ulong)uVar18;
        if (uVar20 != 0) {
          poVar14 = poVar22->resolutions;
          lVar23 = 0;
          do {
            uVar18 = uVar18 - 1;
            uVar12 = *(int *)((long)&poVar14->pdx + lVar23) + uVar18;
            if (uVar12 < 0x20) {
              bVar9 = (byte)uVar12;
              if (poVar22->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar24 = poVar22->dx << (bVar9 & 0x1f);
                uVar12 = pi->dx;
                uVar19 = uVar24;
                if (uVar12 < uVar24) {
                  uVar19 = uVar12;
                }
                if (uVar12 == 0) {
                  uVar19 = uVar24;
                }
                pi->dx = uVar19;
              }
            }
            uVar12 = *(int *)((long)&poVar14->pdy + lVar23) + uVar18;
            if (uVar12 < 0x20) {
              bVar9 = (byte)uVar12;
              if (poVar22->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar24 = poVar22->dy << (bVar9 & 0x1f);
                uVar12 = pi->dy;
                uVar19 = uVar24;
                if (uVar12 < uVar24) {
                  uVar19 = uVar12;
                }
                if (uVar12 == 0) {
                  uVar19 = uVar24;
                }
                pi->dy = uVar19;
              }
            }
            lVar23 = lVar23 + 0x10;
          } while (uVar20 << 4 != lVar23);
        }
        if (pi->dx == 0) {
          return 0;
        }
        if (pi->dy == 0) {
          return 0;
        }
        if (pi->tp_on == '\0') {
          OVar1 = pi->tx0;
          (pi->poc).ty0 = pi->ty0;
          (pi->poc).tx0 = OVar1;
          (pi->poc).ty1 = pi->ty1;
          (pi->poc).tx1 = pi->tx1;
        }
        pi->y = (pi->poc).ty0;
        while (pi->y < (pi->poc).ty1) {
          pi->x = (pi->poc).tx0;
          while (pi->x < (pi->poc).tx1) {
            pi->resno = (pi->poc).resno0;
            while( true ) {
              uVar18 = pi->resno;
              uVar12 = (pi->poc).resno1;
              uVar19 = poVar22->numresolutions;
              if (uVar19 <= uVar12) {
                uVar12 = uVar19;
              }
              if (uVar12 <= uVar18) break;
              uVar19 = uVar19 + ~uVar18;
              if (uVar19 < 0x20) {
                uVar12 = poVar22->dx;
                bVar9 = (byte)uVar19;
                uVar24 = uVar12 << (bVar9 & 0x1f);
                if (uVar24 >> (bVar9 & 0x1f) == uVar12) {
                  uVar8 = poVar22->dy;
                  uVar17 = uVar8 << (bVar9 & 0x1f);
                  if ((uVar17 >> (bVar9 & 0x1f) == uVar8) && (-1 < (int)(uVar17 | uVar24))) {
                    if (uVar12 << (bVar9 & 0x1f) == 0) goto LAB_0012d38a;
                    uVar20 = CONCAT44(0,uVar24);
                    auVar4._8_4_ = 0;
                    auVar4._0_8_ = uVar20;
                    auVar7._8_4_ = 0 >> (bVar9 & 0x1f);
                    auVar7._0_8_ = uVar20 + pi->tx0 + -1;
                    if (uVar8 << (bVar9 & 0x1f) == 0) goto LAB_0012d38a;
                    poVar14 = poVar22->resolutions + uVar18;
                    uVar21 = (ulong)uVar17;
                    uVar18 = poVar14->pdx + uVar19;
                    if ((uVar18 < 0x1f) &&
                       (bVar10 = (byte)uVar18, uVar12 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar19 = poVar14->pdy + uVar19;
                      if (uVar19 < 0x1f) {
                        bVar11 = (byte)uVar19;
                        uVar18 = uVar8 << (bVar11 & 0x1f);
                        if (uVar18 >> (bVar11 & 0x1f) == uVar8) {
                          uVar19 = pi->y;
                          uVar24 = (uint)(((uVar21 + pi->ty0) - 1) / uVar21);
                          if ((uVar19 % uVar18 == 0) ||
                             ((uVar19 == pi->ty0 &&
                              ((uVar24 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar18 = pi->x;
                            uVar8 = SUB124(auVar7 / auVar4,0);
                            if (((uVar18 % (uVar12 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar18 == pi->tx0 &&
                                 ((uVar8 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar14->pw != 0 &&
                                (((poVar14->ph != 0 &&
                                  (uVar8 != (uint)(((ulong)pi->tx1 + (uVar20 - 1)) / uVar20))) &&
                                 (uVar24 != (uint)(((uVar21 + pi->ty1) - 1) / uVar21))))))) {
                              bVar9 = (byte)poVar14->pdx;
                              bVar10 = (byte)poVar14->pdy;
                              pi->precno = (((uint)(((uVar21 - 1) + (ulong)uVar19) / uVar21) >>
                                            (bVar10 & 0x1f)) - (uVar24 >> (bVar10 & 0x1f))) *
                                           poVar14->pw +
                                           (((uint)(((uVar20 - 1) + (ulong)uVar18) / uVar20) >>
                                            (bVar9 & 0x1f)) - (uVar8 >> (bVar9 & 0x1f)));
                              pi->layno = (pi->poc).layno0;
                              while (pi->layno < (pi->poc).layno1) {
                                uVar18 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                         pi->step_r * pi->resno + pi->layno * pi->step_l;
                                if (pi->include_size <= uVar18) goto LAB_0012c88b;
                                pOVar13 = pi->include;
                                uVar20 = (ulong)uVar18;
                                if (pOVar13[uVar20] == 0) goto LAB_0012cc90;
LAB_0012d3ea:
                                pi->layno = pi->layno + 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pi->resno = pi->resno + 1;
            }
            pi->x = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          pi->y = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        pi->compno = pi->compno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_cprl(): invalid compno0/compno1\n";
    break;
  default:
    return 0;
  }
LAB_0012c7b9:
  opj_event_msg(p_event_mgr,1,fmt);
  return 0;
LAB_0012c88b:
  p_event_mgr = pi->manager;
  fmt = "Invalid access to pi->include";
  goto LAB_0012c7b9;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}